

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void alDeleteBuffers(ALsizei n,ALuint *names)

{
  uint name;
  BufferWrapper *pBVar1;
  ALenum AVar2;
  BufferWrapper *__ptr;
  BufferWrapper **ppBVar3;
  ulong uVar4;
  DeviceWrapper *pDVar5;
  
  if (current_context == (ContextWrapper *)0x0) {
    pDVar5 = (DeviceWrapper *)0x0;
  }
  else {
    pDVar5 = current_context->device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alDeleteBuffers);
  IO_UINT64((long)n);
  IO_UINT64((uint64)names);
  if (0 < n) {
    uVar4 = 0;
    do {
      writele32(names[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  (*REAL_alDeleteBuffers)(n,names);
  AVar2 = check_al_error_events();
  if ((pDVar5 != (DeviceWrapper *)0x0 && 0 < n) && AVar2 == 0) {
    uVar4 = 0;
    do {
      name = names[uVar4];
      __ptr = buffer_wrapped_lookup(name);
      if (__ptr != (BufferWrapper *)0x0) {
        pBVar1 = __ptr->hash_next;
        ppBVar3 = pDVar5->wrapped_buffer_hash + (name & 0xff);
        if (__ptr->hash_prev != (BufferWrapper *)0x0) {
          ppBVar3 = &__ptr->hash_prev->hash_next;
        }
        *ppBVar3 = pBVar1;
        if (pBVar1 != (BufferWrapper *)0x0) {
          pBVar1->hash_prev = __ptr->hash_prev;
        }
        free(__ptr);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alDeleteBuffers(ALsizei n, const ALuint *names)
{
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    ALsizei i;

    IO_START(alDeleteBuffers);
    IO_ALSIZEI(n);
    IO_PTR(names);
    for (i = 0; i < n; i++) {
        IO_UINT32(names[i]);
    }

    REAL_alDeleteBuffers(n, names);

    // objects are only deleted if there are no errors.
    if (check_al_error_events() == AL_NO_ERROR) {
        if (device) {
            for (i = 0; i < n; i++) {
                const ALuint name = names[i];
                BufferWrapper *buf = buffer_wrapped_lookup(name);
                if (buf) {
                    if (buf->hash_prev) {
                        buf->hash_prev->hash_next = buf->hash_next;
                    } else {
                        device->wrapped_buffer_hash[hash_alname(name)] = buf->hash_next;
                    }
                    if (buf->hash_next) {
                        buf->hash_next->hash_prev = buf->hash_prev;
                    }
                    free(buf);
                }
            }
        }
    }

    IO_END();
}